

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.h
# Opt level: O0

uint8 * google::protobuf::io::CodedOutputStream::WriteVarint32ToArray(uint32 value,uint8 *target)

{
  byte *local_18;
  uint8 *target_local;
  uint32 value_local;
  
  local_18 = target;
  for (target_local._4_4_ = value; 0x7f < target_local._4_4_;
      target_local._4_4_ = target_local._4_4_ >> 7) {
    *local_18 = (byte)target_local._4_4_ | 0x80;
    local_18 = local_18 + 1;
  }
  *local_18 = (byte)target_local._4_4_;
  return local_18 + 1;
}

Assistant:

inline uint8* CodedOutputStream::WriteVarint32ToArray(uint32 value,
                                                      uint8* target) {
  while (value >= 0x80) {
    *target = static_cast<uint8>(value | 0x80);
    value >>= 7;
    ++target;
  }
  *target = static_cast<uint8>(value);
  return target + 1;
}